

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

uint8_t * __thiscall
cdns::dump_block_parameters
          (cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int cdns_version,
          int *err,FILE *F_out)

{
  byte bVar1;
  byte *in_00;
  uint8_t *in_01;
  size_t __size;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  size_t sStackY_70;
  int64_t val;
  int64_t local_50;
  int64_t inner_val;
  char *local_40;
  char *local_38;
  
  bVar1 = *in >> 5;
  local_40 = out_max;
  in_00 = cbor_get_number(in,in_max,&val);
  if (((cdns_version != 0) || (in_00 == (byte *)0x0)) || (bVar1 != 5)) {
    if (((cdns_version == 1) && (in_00 != (byte *)0x0)) && (bVar1 == 4)) {
      fwrite(" [\n",3,1,(FILE *)F_out);
      local_50 = val;
      if (val == -1) {
        val = 0xffffffff;
      }
      uVar4 = 0;
      for (; ((in_00 < in_max && (in_00 != (byte *)0x0)) && (0 < val)); val = val + -1) {
        if (*in_00 == 0xff) {
          fwrite("        --end of array",0x16,1,(FILE *)F_out);
          if (local_50 == -1) {
            in_00 = in_00 + 1;
            goto LAB_0015a2b6;
          }
          pcVar2 = "        Error, end of array mark unexpected.\n";
          __size = 0x2d;
          goto LAB_0015a278;
        }
        fprintf((FILE *)F_out,"            -- Block parameter %d:\n",(ulong)uVar4);
        uVar4 = uVar4 + 1;
        in_00 = dump_block_parameters_rfc(this,in_00,in_max,out_buf,local_40,err,F_out);
      }
joined_r0x0015a242:
      if (in_00 == (byte *)0x0) {
LAB_0015a288:
        in_00 = (byte *)0x0;
      }
      else {
LAB_0015a2b6:
        fwrite("\n        ]",10,1,(FILE *)F_out);
      }
    }
    else {
      in_00 = (byte *)0x0;
      fprintf((FILE *)F_out,
              "       Error, cannot parse the first bytes of block parameters (version %d), type %d.\n"
              ,(ulong)(uint)cdns_version,(ulong)bVar1);
      *err = -3;
    }
    return in_00;
  }
  fwrite("[\n",2,1,(FILE *)F_out);
  local_50 = val;
  if (val == -1) {
    val = 0xffffffff;
  }
  iVar3 = 0;
LAB_00159f61:
  for (; ((in_00 < in_max && (in_00 != (byte *)0x0)) && (0 < val)); val = val + -1) {
    bVar1 = *in_00;
    if (bVar1 == 0xff) {
      fwrite("\n            --end of array",0x1b,1,(FILE *)F_out);
      if (local_50 != -1) {
        pcVar2 = "            Error, end of array mark unexpected.\n";
        __size = 0x31;
LAB_0015a278:
        fwrite(pcVar2,__size,1,(FILE *)F_out);
        *err = -3;
        goto LAB_0015a288;
      }
      in_00 = in_00 + 1;
      goto LAB_0015a2b6;
    }
    in_01 = cbor_get_number(in_00,in_max,&inner_val);
    if (0x1f < bVar1) goto LAB_00159ff3;
    if (iVar3 != 0) {
      fwrite(",\n",2,1,(FILE *)F_out);
    }
    local_38 = out_buf;
    switch(CONCAT44(inner_val._4_4_,(uint)inner_val)) {
    case 0:
      pcVar2 = "            --query-timeout\n";
      goto LAB_0015a0a3;
    case 1:
      pcVar2 = "            --skew-timeout\n";
      sStackY_70 = 0x1b;
      break;
    case 2:
      pcVar2 = "            --snaplen\n";
      goto LAB_0015a061;
    case 3:
      pcVar2 = "            --promisc\n";
LAB_0015a061:
      sStackY_70 = 0x16;
      break;
    case 4:
      pcVar2 = "            --interfaces\n";
      sStackY_70 = 0x19;
      break;
    case 5:
      pcVar2 = "            --server-addresses\n";
      goto LAB_0015a082;
    case 6:
      pcVar2 = "            --vlan-ids\n";
      sStackY_70 = 0x17;
      break;
    case 7:
      pcVar2 = "            --filter\n";
      sStackY_70 = 0x15;
      break;
    case 8:
      pcVar2 = "            --query-options\n";
LAB_0015a0a3:
      sStackY_70 = 0x1c;
      break;
    case 9:
      pcVar2 = "            --response-options\n";
LAB_0015a082:
      sStackY_70 = 0x1f;
      break;
    case 10:
      pcVar2 = "            --accept-rr-types\n";
      goto LAB_0015a098;
    case 0xb:
      pcVar2 = "            --ignore-rr-types\n";
LAB_0015a098:
      sStackY_70 = 0x1e;
      break;
    case 0xc:
      pcVar2 = "            --max-block-qr-items\n";
      sStackY_70 = 0x21;
      break;
    default:
      goto switchD_00159fe5_default;
    }
    fwrite(pcVar2,sStackY_70,1,(FILE *)F_out);
switchD_00159fe5_default:
    iVar3 = iVar3 + 1;
    fprintf((FILE *)F_out,"            %d,",(ulong)(uint)inner_val);
    in_00 = cbor_to_text(in_01,in_max,&local_38,local_40,err);
    fwrite(out_buf,1,(long)local_38 - (long)out_buf,(FILE *)F_out);
  }
  goto joined_r0x0015a242;
LAB_00159ff3:
  fprintf((FILE *)F_out,"        Unexpected type: %d(%d)\n",(ulong)(bVar1 >> 5),
          (ulong)(uint)inner_val);
  *err = -3;
  in_00 = (byte *)0x0;
  goto LAB_00159f61;
}

Assistant:

uint8_t* cdns::dump_block_parameters(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int cdns_version, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in != NULL && outer_type == CBOR_T_MAP && cdns_version == 0) {
        /* Input is in draft-04 format */
        int rank = 0;
        fprintf(F_out, "[\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                fprintf(F_out, "\n            --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "            Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (inner_type != CBOR_T_UINT) {
                    fprintf(F_out, "        Unexpected type: %d(%d)\n", inner_type, (int)inner_val);
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (rank != 0) {
                        fprintf(F_out, ",\n");
                    }
                    rank++;
                    {
                        /* Type definitions copies fro source code of compactor */
                        p_out = out_buf;
                        if (inner_val == 0) {
                            fprintf(F_out, "            --query-timeout\n");
                        }
                        else if (inner_val == 1) {
                            fprintf(F_out, "            --skew-timeout\n");
                        }
                        else if (inner_val == 2) {
                            fprintf(F_out, "            --snaplen\n");
                        }
                        else if (inner_val == 3) {
                            fprintf(F_out, "            --promisc\n");
                        }
                        else if (inner_val == 4) {
                            fprintf(F_out, "            --interfaces\n"); /* V0.5 only? */
                        }
                        else if (inner_val == 5) {
                            fprintf(F_out, "            --server-addresses\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 6) {
                            fprintf(F_out, "            --vlan-ids\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 7) {
                            fprintf(F_out, "            --filter\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 8) {
                            fprintf(F_out, "            --query-options\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 9) {
                            fprintf(F_out, "            --response-options\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 10) {
                            fprintf(F_out, "            --accept-rr-types\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 11) {
                            fprintf(F_out, "            --ignore-rr-types\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 12) {
                            fprintf(F_out, "            --max-block-qr-items\n"); /* v0.5 only? */
                        }
                        fprintf(F_out, "            %d,", (int)inner_val);
                        in = cbor_to_text(in, in_max, &p_out, out_max, err);
                        fwrite(out_buf, 1, p_out - out_buf, F_out);
                    }
                    val--;
                }
            }
        }


        if (in != NULL) {
            fprintf(F_out, "\n        ]");
        }
    }
    else if (in != NULL && outer_type == CBOR_T_ARRAY && cdns_version == 1) {
        /* Block parameter in Array format */
        int rank = 0;

        fprintf(F_out, " [\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                fprintf(F_out, "        --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "        Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                p_out = out_buf;
                fprintf(F_out, "            -- Block parameter %d:\n", rank);
                rank++;

                in = dump_block_parameters_rfc(in, in_max, out_buf, out_max, err, F_out);
                val--;
            }
        }

        if (in != NULL) {
            fprintf(F_out, "\n        ]");
        }
    }
    else {
        fprintf(F_out, "       Error, cannot parse the first bytes of block parameters (version %d), type %d.\n", cdns_version, outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }

    return in;
}